

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_view_info.cpp
# Opt level: O1

void __thiscall
duckdb::CreateViewInfo::CreateViewInfo
          (CreateViewInfo *this,SchemaCatalogEntry *schema,string *view_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string *psVar3;
  string local_88;
  string local_68;
  string local_48;
  
  psVar3 = Catalog::GetName_abi_cxx11_((schema->super_InCatalogEntry).catalog);
  pcVar2 = (psVar3->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + psVar3->_M_string_length);
  pcVar2 = (schema->super_InCatalogEntry).super_CatalogEntry.name._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,
             pcVar2 + (schema->super_InCatalogEntry).super_CatalogEntry.name._M_string_length);
  local_88._M_dataplus._M_p = (view_name->_M_dataplus)._M_p;
  paVar1 = &view_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == paVar1) {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_88.field_2._8_8_ = *(undefined8 *)((long)&view_name->field_2 + 8);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_88._M_string_length = view_name->_M_string_length;
  (view_name->_M_dataplus)._M_p = (pointer)paVar1;
  view_name->_M_string_length = 0;
  (view_name->field_2)._M_local_buf[0] = '\0';
  CreateViewInfo(this,&local_48,&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

CreateViewInfo::CreateViewInfo(SchemaCatalogEntry &schema, string view_name)
    : CreateViewInfo(schema.catalog.GetName(), schema.name, std::move(view_name)) {
}